

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcVector::IfcVector(IfcVector *this)

{
  IfcVector *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x40,"IfcVector");
  IfcGeometricRepresentationItem::IfcGeometricRepresentationItem
            (&this->super_IfcGeometricRepresentationItem,&PTR_construction_vtable_24__00fa9ee0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcVector,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcVector,_2UL> *)
             &(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20,
             &PTR_construction_vtable_24__00fa9f28);
  (this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xfa9e50;
  *(undefined8 *)&this->field_0x40 = 0xfa9ec8;
  *(undefined8 *)
   &(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xfa9e78;
  *(undefined8 *)
   &(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xfa9ea0;
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcDirection> *)
             &(this->super_IfcGeometricRepresentationItem).field_0x30,(LazyObject *)0x0);
  return;
}

Assistant:

IfcVector() : Object("IfcVector") {}